

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration
          (DescriptorBuilder *this,string_view full_name,
          RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *declarations,
          DescriptorProto_ExtensionRange *proto,
          flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *full_name_set)

{
  uint uVar1;
  _Alloc_hider _Var2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  string_view type;
  bool bVar3;
  Rep *pRVar4;
  DescriptorProto_ExtensionRange *key;
  void **ppvVar5;
  string_view element_name;
  string_view symbol;
  string_view symbol_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  extension_number_set;
  size_t in_stack_fffffffffffffed8;
  undefined8 uVar6;
  undefined1 local_110 [16];
  HeapOrSoo local_100;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f0;
  bool local_d0;
  int local_c4;
  _Alloc_hider local_c0;
  void **local_b8;
  VoidPtr local_b0;
  code *pcStack_a8;
  VoidPtr local_a0;
  code *pcStack_98;
  VoidPtr local_90;
  code *pcStack_88;
  VoidPtr local_80;
  code *pcStack_78;
  VoidPtr local_70;
  code *pcStack_68;
  VoidPtr local_60;
  code *pcStack_58;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_50;
  
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  ppvVar5 = (void **)declarations;
  local_100.heap.slot_array = (MaybeInitializedPtr)this;
  local_c0._M_p = (pointer)full_name_set;
  if (((ulong)(declarations->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&declarations->super_RepeatedPtrFieldBase);
    ppvVar5 = pRVar4->elements;
  }
  local_b8 = (void **)declarations;
  if (((ulong)(declarations->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&declarations->super_RepeatedPtrFieldBase);
    local_b8 = pRVar4->elements;
  }
  local_b8 = local_b8 + (declarations->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar5 != local_b8) {
    do {
      _Var2._M_p = (pointer)*ppvVar5;
      if ((*(int *)(_Var2._M_p + 0x28) < (proto->field_0)._impl_.start_) ||
         ((proto->field_0)._impl_.end_ <= *(int *)(_Var2._M_p + 0x28))) {
        pcStack_58 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = &local_f0;
        local_f0._M_value._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
        local_60.obj = &local_f0;
        AddError((DescriptorBuilder *)local_100.heap.slot_array,full_name,&proto->super_Message,
                 NUMBER,make_error);
      }
      local_c4 = *(int *)(_Var2._M_p + 0x28);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
      ::EmplaceDecomposable::operator()
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                  *)&local_f0,&stack0xfffffffffffffee0,&local_c4,&local_c4);
      if (local_f0._16_1_ == '\0') {
        pcStack_68 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__1,std::__cxx11::string>
        ;
        make_error_00.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__1,std::__cxx11::string>
        ;
        make_error_00.ptr_.obj = &local_f0;
        local_f0._M_value._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
        local_70.obj = &local_f0;
        AddError((DescriptorBuilder *)local_100.heap.slot_array,full_name,&proto->super_Message,
                 NUMBER,make_error_00);
      }
      uVar1 = *(uint *)(_Var2._M_p + 0x10);
      if ((~uVar1 & 3) == 0) {
        key = (DescriptorProto_ExtensionRange *)(*(ulong *)(_Var2._M_p + 0x18) & 0xfffffffffffffffc)
        ;
        uVar6 = local_c0._M_p;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                    *)&local_f0,&stack0xfffffffffffffee0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key);
        if (local_f0._16_1_ == '\0') {
          pcStack_88 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__3,std::__cxx11::string>
          ;
          make_error_04.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__3,std::__cxx11::string>
          ;
          make_error_04.ptr_.obj = &local_f0;
          element_name._M_str = *(char **)(*(ulong *)(_Var2._M_p + 0x18) & 0xfffffffffffffffc);
          element_name._M_len =
               ((undefined8 *)(*(ulong *)(_Var2._M_p + 0x18) & 0xfffffffffffffffc))[1];
          local_f0._M_value._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
          local_90.obj = &local_f0;
          AddError((DescriptorBuilder *)local_100.heap.slot_array,element_name,&proto->super_Message
                   ,NAME,make_error_04);
          break;
        }
        symbol._M_str = (char *)key;
        symbol._M_len = *(size_t *)(*(ulong *)(_Var2._M_p + 0x18) & 0xfffffffffffffffc);
        protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,
                   (_anonymous_namespace_ *)
                   ((size_t *)(*(ulong *)(_Var2._M_p + 0x18) & 0xfffffffffffffffc))[1],symbol);
        if (local_d0 == true) {
          local_100.soo_data[0] = '\0';
          uVar6 = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffee0,local_f0._M_value._M_dataplus._M_p,
                     (pointer)(local_f0._M_value._M_string_length +
                              (long)local_f0._M_value._M_dataplus._M_p));
          local_100.soo_data[0] = '\x01';
          pcStack_98 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__4,std::__cxx11::string>
          ;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__4,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = &stack0xfffffffffffffee0;
          key = proto;
          local_a0.obj = &stack0xfffffffffffffee0;
          AddError((DescriptorBuilder *)local_100.heap.slot_array,full_name,&proto->super_Message,
                   NAME,make_error_01);
          if ((local_100.soo_data[0] == '\x01') &&
             (local_100.soo_data[0] = '\0', (undefined1 *)uVar6 != local_110)) {
            operator_delete((void *)uVar6,local_110._0_8_ + 1);
          }
        }
        type._M_str = (char *)uVar6;
        type._M_len = in_stack_fffffffffffffed8;
        bVar3 = anon_unknown_24::IsNonMessageType(type);
        if (!bVar3) {
          symbol_00._M_str = (char *)key;
          symbol_00._M_len = *(size_t *)(*(ulong *)(_Var2._M_p + 0x20) & 0xfffffffffffffffc);
          protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xfffffffffffffee0,
                     (_anonymous_namespace_ *)
                     ((size_t *)(*(ulong *)(_Var2._M_p + 0x20) & 0xfffffffffffffffc))[1],symbol_00);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_f0,
                           (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xfffffffffffffee0);
          if ((local_100.soo_data[0] == '\x01') &&
             (local_100.soo_data[0] = '\0', (undefined1 *)uVar6 != local_110)) {
            operator_delete((void *)uVar6,local_110._0_8_ + 1);
          }
          if (local_d0 == true) {
            local_100.soo_data[0] = '\0';
            uVar6 = local_110;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&stack0xfffffffffffffee0,local_f0._M_value._M_dataplus._M_p,
                       (pointer)(local_f0._M_value._M_string_length +
                                (long)local_f0._M_value._M_dataplus._M_p));
            local_100.soo_data[0] = '\x01';
            pcStack_a8 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__5,std::__cxx11::string>
            ;
            make_error_02.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__5,std::__cxx11::string>
            ;
            make_error_02.ptr_.obj = &stack0xfffffffffffffee0;
            local_b0.obj = &stack0xfffffffffffffee0;
            AddError((DescriptorBuilder *)local_100.heap.slot_array,full_name,&proto->super_Message,
                     NAME,make_error_02);
            if ((local_100.soo_data[0] == '\x01') &&
               (local_100.soo_data[0] = '\0', (undefined1 *)uVar6 != local_110)) {
              operator_delete((void *)uVar6,local_110._0_8_ + 1);
            }
          }
        }
        if ((local_d0 == true) &&
           (local_d0 = false,
           local_f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f0._M_value + 0x10))) {
          operator_delete((void *)local_f0._M_value._M_dataplus._M_p,
                          CONCAT71(local_f0._17_7_,local_f0._16_1_) + 1);
        }
      }
      else if ((((uVar1 >> 1 ^ uVar1) & 1) != 0) || (_Var2._M_p[0x2c] == '\0')) {
        pcStack_78 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2,std::__cxx11::string>
        ;
        make_error_03.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2,std::__cxx11::string>
        ;
        make_error_03.ptr_.obj = &local_f0;
        local_f0._M_value._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
        local_80.obj = &local_f0;
        AddError((DescriptorBuilder *)local_100.heap.slot_array,full_name,&proto->super_Message,
                 EXTENDEE,make_error_03);
      }
      ppvVar5 = ppvVar5 + 1;
    } while (ppvVar5 != local_b8);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::destructor_impl(&local_50);
  return;
}

Assistant:

void DescriptorBuilder::ValidateExtensionDeclaration(
    const absl::string_view full_name,
    const RepeatedPtrField<ExtensionRangeOptions_Declaration>& declarations,
    const DescriptorProto_ExtensionRange& proto,
    absl::flat_hash_set<absl::string_view>& full_name_set) {
  absl::flat_hash_set<int> extension_number_set;
  for (const auto& declaration : declarations) {
    if (declaration.number() < proto.start() ||
        declaration.number() >= proto.end()) {
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NUMBER, [&] {
        return absl::Substitute(
            "Extension declaration number $0 is not in the "
            "extension range.",
            declaration.number());
      });
    }

    if (!extension_number_set.insert(declaration.number()).second) {
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NUMBER, [&] {
        return absl::Substitute(
            "Extension declaration number $0 is declared multiple times.",
            declaration.number());
      });
    }

    // Both full_name and type should be present. If none of them is set,
    // add an error unless reserved is set to true. If only one of them is set,
    // add an error whether or not reserved is set to true.
    if (!declaration.has_full_name() || !declaration.has_type()) {
      if (declaration.has_full_name() != declaration.has_type() ||
          !declaration.reserved()) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::EXTENDEE,
                 [&] {
                   return absl::StrCat(
                       "Extension declaration #", declaration.number(),
                       " should have both \"full_name\" and \"type\" set.");
                 });
      }
    } else {
      if (!full_name_set.insert(declaration.full_name()).second) {
        AddError(
            declaration.full_name(), proto,
            DescriptorPool::ErrorCollector::NAME, [&] {
              return absl::Substitute(
                  "Extension field name \"$0\" is declared multiple times.",
                  declaration.full_name());
            });
        return;
      }
      absl::optional<std::string> err =
          ValidateSymbolForDeclaration(declaration.full_name());
      if (err.has_value()) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 [err] { return *err; });
      }
      if (!IsNonMessageType(declaration.type())) {
        err = ValidateSymbolForDeclaration(declaration.type());
        if (err.has_value()) {
          AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                   [err] { return *err; });
        }
      }
    }
  }
}